

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void __thiscall llvm::APInt::shlSlowCase(APInt *this,uint ShiftAmt)

{
  uint uVar1;
  
  tcShiftLeft((this->U).pVal,(uint)((ulong)this->BitWidth + 0x3f >> 6),ShiftAmt);
  uVar1 = this->BitWidth;
  if (0x40 < (ulong)uVar1) {
    this = (APInt *)((this->U).pVal + ((int)((ulong)uVar1 + 0x3f >> 6) - 1));
  }
  (this->U).VAL = ((this->U).VAL << (-(char)uVar1 & 0x3fU)) >> (-(char)uVar1 & 0x3fU);
  return;
}

Assistant:

void APInt::shlSlowCase(unsigned ShiftAmt) {
  tcShiftLeft(U.pVal, getNumWords(), ShiftAmt);
  clearUnusedBits();
}